

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tiled_Image.cxx
# Opt level: O2

int __thiscall Fl_Tiled_Image::copy(Fl_Tiled_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Fl_Tiled_Image *this_00;
  
  if (((this->super_Fl_Image).w_ != (int)dst) ||
     (this_00 = this, (this->super_Fl_Image).h_ != (int)src)) {
    this_00 = (Fl_Tiled_Image *)operator_new(0x38);
    Fl_Tiled_Image(this_00,this->image_,(int)dst,(int)src);
  }
  return (int)this_00;
}

Assistant:

Fl_Image *			// O - New image
Fl_Tiled_Image::copy(int W,	// I - New width
                     int H) {	// I - New height
  if (W == w() && H == h()) return this;
  else return new Fl_Tiled_Image(image_, W, H);
}